

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_long>
               (uchar **strings,size_t n,size_t depth,
               vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar1;
  uchar *puVar2;
  uchar *puVar3;
  iterator iVar4;
  size_t n_00;
  int iVar5;
  uint j;
  long lVar6;
  pointer *pppuVar7;
  uchar **ppuVar8;
  size_t __n;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  uint j_1;
  uint i;
  uchar **ppuVar12;
  long lVar13;
  size_t sVar14;
  array<unsigned_long,_256UL> bucketsize;
  size_t local_838 [2];
  int aiStack_828 [510];
  
  if (n < 0x20) {
    if (1 < n) {
      ppuVar8 = strings;
      do {
        puVar2 = ppuVar8[1];
        ppuVar8 = ppuVar8 + 1;
        for (ppuVar12 = ppuVar8; strings < ppuVar12; ppuVar12 = ppuVar12 + -1) {
          puVar3 = ppuVar12[-1];
          bVar10 = puVar3[depth];
          bVar11 = puVar2[depth];
          if ((bVar10 != 0) && (lVar6 = depth + 1, bVar10 == bVar11)) {
            do {
              bVar10 = puVar3[lVar6];
              bVar11 = puVar2[lVar6];
              if (bVar10 == 0) break;
              lVar6 = lVar6 + 1;
            } while (bVar10 == bVar11);
          }
          if (bVar10 <= bVar11) break;
          *ppuVar12 = puVar3;
        }
        iVar5 = (int)n;
        *ppuVar12 = puVar2;
        n = (size_t)(iVar5 - 1);
      } while (2 < iVar5);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      ppuVar8 = strings;
      do {
        lVar6 = 0;
        do {
          *(uchar *)((long)local_838 + lVar6) = ppuVar8[lVar6][depth];
          lVar6 = lVar6 + 1;
        } while (lVar6 != 0x20);
        lVar6 = 0;
        ppuVar12 = ppuVar8;
        do {
          pvVar1 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                   (buckets + *(byte *)((long)local_838 + lVar6));
          iVar4._M_current = *(uchar ***)(pvVar1 + 8);
          if (iVar4._M_current == *(uchar ***)(pvVar1 + 0x10)) {
            std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
            _M_realloc_insert<unsigned_char*const&>(pvVar1,iVar4,ppuVar12);
          }
          else {
            *iVar4._M_current = *ppuVar12;
            *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
          }
          lVar6 = lVar6 + 1;
          ppuVar12 = ppuVar12 + 1;
        } while (lVar6 != 0x20);
        uVar9 = uVar9 + 0x20;
        ppuVar8 = ppuVar8 + 0x20;
      } while (uVar9 < (n & 0xffffffffffffffe0));
    }
    lVar6 = n - uVar9;
    if (uVar9 <= n && lVar6 != 0) {
      ppuVar8 = strings + uVar9;
      do {
        pvVar1 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                 (buckets + (*ppuVar8)[depth]);
        iVar4._M_current = *(uchar ***)(pvVar1 + 8);
        if (iVar4._M_current == *(uchar ***)(pvVar1 + 0x10)) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>(pvVar1,iVar4,ppuVar8);
        }
        else {
          *iVar4._M_current = *ppuVar8;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
        ppuVar8 = ppuVar8 + 1;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    pppuVar7 = &buckets[1].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    lVar6 = 0;
    do {
      uVar9 = (long)*pppuVar7 - (long)((_Vector_impl_data *)(pppuVar7 + -1))->_M_start;
      local_838[lVar6] =
           CONCAT44((int)((long)pppuVar7[-3] - (long)pppuVar7[-4] >> 0x23),
                    (int)((ulong)((long)pppuVar7[-3] - (long)pppuVar7[-4]) >> 3));
      aiStack_828[lVar6 * 2] = (int)(uVar9 >> 3);
      aiStack_828[lVar6 * 2 + 1] = (int)((long)uVar9 >> 0x23);
      lVar6 = lVar6 + 2;
      pppuVar7 = pppuVar7 + 6;
    } while (lVar6 != 0x100);
    pppuVar7 = &(buckets->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    lVar6 = 0;
    lVar13 = 0;
    do {
      sVar14 = local_838[lVar6];
      if (sVar14 != 0) {
        __n = (long)*pppuVar7 - (long)((_Vector_impl_data *)(pppuVar7 + -1))->_M_start;
        if (__n != 0) {
          memmove(strings + lVar13,((_Vector_impl_data *)(pppuVar7 + -1))->_M_start,__n);
        }
        lVar13 = lVar13 + sVar14;
      }
      lVar6 = lVar6 + 1;
      pppuVar7 = pppuVar7 + 3;
    } while (lVar6 != 0x100);
    lVar6 = 8;
    do {
      lVar13 = *(long *)((long)buckets + lVar6 + -8);
      if (*(long *)((long)&(buckets->
                           super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar6) != lVar13) {
        *(long *)((long)&(buckets->
                         super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar6) = lVar13;
      }
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x1808);
    lVar6 = 1;
    sVar14 = local_838[0];
    do {
      n_00 = local_838[lVar6];
      if (n_00 != 0) {
        msd_D<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_long>
                  (strings + sVar14,n_00,depth + 1,buckets);
        sVar14 = sVar14 + n_00;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}